

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>::
rebalance_left_to_right
          (btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
           *this,int to_move,
          btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
          *right,allocator_type *alloc)

{
  btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
  bVar1;
  uint uVar2;
  ulong uVar3;
  btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
  *pbVar4;
  char *__function;
  long lVar5;
  int iVar6;
  long lVar7;
  size_type sVar8;
  int i;
  bool bVar9;
  
  if ((((ulong)this & 7) != 0) || (((ulong)right & 7) != 0)) {
    __function = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
    ;
    goto LAB_0027488b;
  }
  if (*(long *)this != *(long *)right) {
    __assert_fail("parent() == right->parent()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x8ab,
                  "void phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>]"
                 );
  }
  if ((byte)this[8] + 1 != (uint)(byte)right[8]) {
    __assert_fail("position() + 1 == right->position()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x8ac,
                  "void phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>]"
                 );
  }
  bVar1 = right[10];
  if ((byte)this[10] < (byte)bVar1) {
    __assert_fail("count() >= right->count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x8ad,
                  "void phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>]"
                 );
  }
  if (to_move < 1) {
    __assert_fail("to_move >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x8ae,
                  "void phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>]"
                 );
  }
  if ((uint)(byte)this[10] < (uint)to_move) {
    __assert_fail("to_move <= count()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x8af,
                  "void phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>]"
                 );
  }
  lVar7 = (long)to_move;
  if ((uint)(byte)bVar1 < (uint)to_move) {
    uninitialized_move_n(right,(ulong)(byte)bVar1,0,(ulong)(uint)to_move,right,alloc);
    if ((*(ulong *)this & 7) == 0) {
      uVar3 = lVar7 - 1;
      *(undefined4 *)(right + (uVar3 & 0xffffffff) * 4 + 0xc) =
           *(undefined4 *)(*(ulong *)this + 0xc + (ulong)(byte)this[8] * 4);
      sVar8 = (size_type)(int)(~(uint)(byte)right[10] + to_move);
      uninitialized_move_n(this,sVar8,(byte)this[10] - sVar8,(ulong)(byte)right[10],right,alloc);
      if (sVar8 != uVar3) {
        bVar1 = this[10];
        lVar5 = 0;
        do {
          *(undefined4 *)(right + lVar5 + 0xc) =
               *(undefined4 *)(this + lVar5 + ((byte)bVar1 - uVar3) * 4 + 0xc);
          lVar5 = lVar5 + 4;
        } while ((long)(int)uVar3 * 4 + sVar8 * -4 != lVar5);
      }
LAB_002747a0:
      if ((*(ulong *)this & 7) == 0) {
        *(undefined4 *)(*(ulong *)this + 0xc + (ulong)(byte)this[8] * 4) =
             *(undefined4 *)(this + ((ulong)(byte)this[10] - lVar7) * 4 + 0xc);
        if (this[0xb] ==
            (btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
             )0x0) {
          sVar8 = (size_type)(byte)right[10];
          do {
            pbVar4 = child(right,sVar8);
            init_child(right,to_move + (int)sVar8,pbVar4);
            mutable_child(right,sVar8);
            bVar9 = sVar8 != 0;
            sVar8 = sVar8 - 1;
          } while (bVar9);
          iVar6 = 1 - to_move;
          i = 0;
          do {
            pbVar4 = child(this,(long)(int)((uint)(byte)this[10] + iVar6));
            init_child(right,i,pbVar4);
            mutable_child(this,(long)(int)((uint)(byte)this[10] + iVar6));
            iVar6 = iVar6 + 1;
            i = i + 1;
          } while (iVar6 != 1);
        }
        this[10] = (btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                    )((char)this[10] - (char)to_move);
        right[10] = (btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                     )((char)right[10] + (char)to_move);
        return;
      }
    }
  }
  else {
    uninitialized_move_n
              (right,(ulong)(uint)to_move,(long)(int)((uint)(byte)bVar1 - to_move),
               (ulong)(byte)bVar1,right,alloc);
    bVar1 = right[10];
    if (((uint)to_move < (uint)(byte)bVar1) &&
       (uVar2 = ~to_move + (uint)(byte)bVar1, -1 < (int)uVar2)) {
      uVar3 = (ulong)uVar2 * 4 + 0x10;
      pbVar4 = right + (ulong)(byte)bVar1 * 4 + 8;
      do {
        *(undefined4 *)pbVar4 = *(undefined4 *)(right + (uVar3 - 4));
        uVar3 = uVar3 - 4;
        pbVar4 = pbVar4 + -4;
      } while (0xf < uVar3);
    }
    if ((*(ulong *)this & 7) == 0) {
      uVar3 = lVar7 - 1;
      *(undefined4 *)(right + (uVar3 & 0xffffffff) * 4 + 0xc) =
           *(undefined4 *)(*(ulong *)this + 0xc + (ulong)(byte)this[8] * 4);
      if (uVar3 != 0) {
        bVar1 = this[10];
        lVar5 = 0;
        do {
          *(undefined4 *)(right + lVar5 + 0xc) =
               *(undefined4 *)(this + lVar5 + ((byte)bVar1 - uVar3) * 4 + 0xc);
          lVar5 = lVar5 + 4;
        } while ((long)(int)uVar3 * 4 != lVar5);
      }
      goto LAB_002747a0;
    }
  }
  __function = 
  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
  ;
LAB_0027488b:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,__function);
}

Assistant:

void btree_node<P>::rebalance_left_to_right(const int to_move,
                                                btree_node *right,
                                                allocator_type *alloc) {
        assert(parent() == right->parent());
        assert(position() + 1 == right->position());
        assert(count() >= right->count());
        assert(to_move >= 1);
        assert(to_move <= count());

        // Values in the right node are shifted to the right to make room for the
        // new to_move values. Then, the delimiting value in the parent and the
        // other (to_move - 1) values in the left node are moved into the right node.
        // Lastly, a new delimiting value is moved from the left node into the
        // parent, and the remaining empty left node entries are destroyed.

        if (right->count() >= to_move) {
            // The original location of the right->count() values are sufficient to hold
            // the new to_move entries from the parent and left node.

            // 1) Shift existing values in the right node to their correct positions.
            right->uninitialized_move_n(to_move, right->count() - to_move,
                                        right->count(), right, alloc);
            if (right->count() > to_move) {
                for (slot_type *src = right->slot(right->count() - to_move - 1),
                         *dest = right->slot(right->count() - 1),
                         *end = right->slot(0);
                     src >= end; --src, --dest) {
                    params_type::move(alloc, src, dest);
                }
            }

            // 2) Move the delimiting value in the parent to the right node.
            params_type::move(alloc, parent()->slot(position()),
                              right->slot(to_move - 1));

            // 3) Move the (to_move - 1) values from the left node to the right node.
            params_type::move(alloc, slot(count() - (to_move - 1)), slot(count()),
                              right->slot(0));
        } else {
            // The right node does not have enough initialized space to hold the new
            // to_move entries, so part of them will move to uninitialized space.

            // 1) Shift existing values in the right node to their correct positions.
            right->uninitialized_move_n(right->count(), 0, to_move, right, alloc);

            // 2) Move the delimiting value in the parent to the right node.
            right->value_init(to_move - 1, alloc, parent()->slot(position()));

            // 3) Move the (to_move - 1) values from the left node to the right node.
            const size_type uninitialized_remaining = to_move - right->count() - 1;
            uninitialized_move_n(uninitialized_remaining,
                                 count() - uninitialized_remaining, right->count(),
                                 right, alloc);
            params_type::move(alloc, slot(count() - (to_move - 1)),
                              slot(count() - uninitialized_remaining), right->slot(0));
        }

        // 4) Move the new delimiting value to the parent from the left node.
        params_type::move(alloc, slot(count() - to_move), parent()->slot(position()));

        // 5) Destroy the now-empty to_move entries in the left node.
        value_destroy_n(count() - to_move, to_move, alloc);

        if (!leaf()) {
            // Move the child pointers from the left to the right node.
            for (int i = right->count(); i >= 0; --i) {
                right->init_child(i + to_move, right->child(i));
                right->clear_child(i);
            }
            for (int i = 1; i <= to_move; ++i) {
                right->init_child(i - 1, child(count() - to_move + i));
                clear_child(count() - to_move + i);
            }
        }

        // Fixup the counts on the left and right nodes.
        set_count((field_type)(count() - to_move));
        right->set_count((field_type)(right->count() + to_move));
    }